

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
eglu::attribMapToList(vector<int,_std::allocator<int>_> *__return_storage_ptr__,AttribMap *attribs)

{
  bool bVar1;
  pointer ppVar2;
  value_type_conflict1 local_40 [4];
  _Self local_30;
  _Self local_28;
  const_iterator it;
  AttribMap *attribs_local;
  vector<int,_std::allocator<int>_> *attribList;
  
  it._M_node._7_1_ = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  local_28._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                 (attribs);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                   (attribs);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->(&local_28);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&ppVar2->first);
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->(&local_28);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&ppVar2->second);
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator++(&local_28);
  }
  local_40[0] = 0x3038;
  std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,local_40);
  return __return_storage_ptr__;
}

Assistant:

vector<EGLint> attribMapToList (const AttribMap& attribs)
{
	vector<EGLint> attribList;

	for (AttribMap::const_iterator it = attribs.begin(); it != attribs.end(); ++it)
	{
		attribList.push_back(it->first);
		attribList.push_back(it->second);
	}

	attribList.push_back(EGL_NONE);

	return attribList;
}